

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtensionalityClauseContainer.cpp
# Opt level: O0

Literal * Saturation::ExtensionalityClauseContainer::getSingleVarEq(Clause *c)

{
  ExtensionalityClause elem;
  bool bVar1;
  uint uVar2;
  Literal **ppLVar3;
  TermList TVar4;
  Literal *extraout_RAX;
  Clause *in_RDI;
  Clause *this;
  Literal *varEq;
  uint i;
  List<Saturation::ExtensionalityClause> **in_stack_ffffffffffffff80;
  List<Saturation::ExtensionalityClause> ***in_stack_ffffffffffffff88;
  TermList key;
  undefined1 auStack_20 [4];
  uint local_1c;
  Term *local_18;
  uint local_c;
  Clause *local_8;
  
  local_c = 0;
  local_8 = in_RDI;
  while( true ) {
    local_1c = local_c;
    this = local_8;
    uVar2 = Kernel::Clause::length(local_8);
    if (uVar2 <= local_1c) {
      key._content = (uint64_t)auStack_20;
      TVar4._content = (uint64_t)Lib::List<Saturation::ExtensionalityClause>::empty();
      Lib::
      DHMap<Kernel::TermList,_Lib::List<Saturation::ExtensionalityClause>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
      ::getValuePtr((DHMap<Kernel::TermList,_Lib::List<Saturation::ExtensionalityClause>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                     *)this,key,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      elem.sort._content = TVar4._content;
      elem._0_16_ = *(undefined1 (*) [16])(key._content + 8);
      Lib::List<Saturation::ExtensionalityClause>::push
                (elem,(List<Saturation::ExtensionalityClause> **)key._content);
      return extraout_RAX;
    }
    ppLVar3 = Kernel::Clause::operator[](local_8,local_c);
    local_18 = &(*ppLVar3)->super_Term;
    bVar1 = Kernel::Term::isTwoVarEquality(local_18);
    if ((bVar1) && (bVar1 = Kernel::Literal::isPositive((Literal *)0xac410d), bVar1)) break;
    local_c = local_c + 1;
  }
  return (Literal *)local_18;
}

Assistant:

Literal* ExtensionalityClauseContainer::getSingleVarEq(Clause* c) {
  for (unsigned i = 0; i < c->length(); ++i) {
    Literal* varEq = (*c)[i];
    if (varEq->isTwoVarEquality() && varEq->isPositive()) {
      return varEq;
      break;
    }
  }
  ASSERTION_VIOLATION;
}